

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_png.cpp
# Opt level: O3

bool M_AppendPNGChunk(FILE *file,DWORD chunkID,BYTE *chunkData,DWORD len)

{
  undefined4 uVar1;
  uint uVar2;
  size_t sVar3;
  DWORD *pDVar4;
  bool bVar5;
  DWORD head [2];
  uint local_34;
  uint local_30;
  DWORD local_2c;
  
  local_30 = len >> 0x18 | (len & 0xff0000) >> 8 | (len & 0xff00) << 8 | len << 0x18;
  local_2c = chunkID;
  sVar3 = fwrite(&local_30,1,8,(FILE *)file);
  if (sVar3 == 8) {
    pDVar4 = &local_2c;
    if (len == 0) {
      uVar1 = 0;
      len = 4;
    }
    else {
      sVar3 = fwrite(chunkData,1,(ulong)len,(FILE *)file);
      if (sVar3 != len) goto LAB_004f4c2c;
      uVar1 = crc32(0,pDVar4,4);
      pDVar4 = (DWORD *)chunkData;
    }
    uVar2 = crc32(uVar1,pDVar4,len);
    local_34 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    sVar3 = fwrite(&local_34,1,4,(FILE *)file);
    bVar5 = sVar3 == 4;
  }
  else {
LAB_004f4c2c:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool M_AppendPNGChunk (FILE *file, DWORD chunkID, const BYTE *chunkData, DWORD len)
{
	DWORD head[2] = { BigLong((unsigned int)len), chunkID };
	DWORD crc;

	if (fwrite (head, 1, 8, file) == 8 &&
		(len == 0 || fwrite (chunkData, 1, len, file) == len))
	{
		crc = CalcCRC32 ((BYTE *)&head[1], 4);
		if (len != 0)
		{
			crc = AddCRC32 (crc, chunkData, len);
		}
		crc = BigLong((unsigned int)crc);
		return fwrite (&crc, 1, 4, file) == 4;
	}
	return false;
}